

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O2

void __thiscall rtosc::AutomationMgr::clearSlot(AutomationMgr *this,int slot_id)

{
  uint uVar1;
  AutomationSlot *pAVar2;
  long lVar3;
  int i;
  int sub;
  
  uVar1 = this->nslots;
  if (-1 < slot_id && slot_id < (int)uVar1) {
    pAVar2 = this->slots;
    pAVar2[(uint)slot_id].active = false;
    pAVar2[(uint)slot_id].used = false;
    if (pAVar2[(uint)slot_id].learning != 0) {
      this->learn_queue_len = this->learn_queue_len + -1;
    }
    for (lVar3 = 0; (ulong)uVar1 * 0xa0 - lVar3 != 0; lVar3 = lVar3 + 0xa0) {
      if (pAVar2[(uint)slot_id].learning < *(int *)(pAVar2->name + lVar3 + -0x10)) {
        *(int *)(pAVar2->name + lVar3 + -0x10) = *(int *)(pAVar2->name + lVar3 + -0x10) + -1;
      }
    }
    pAVar2[(uint)slot_id].learning = -1;
    pAVar2[(uint)slot_id].midi_cc = -1;
    pAVar2[(uint)slot_id].midi_nrpn = -1;
    memset(&pAVar2[(uint)slot_id].current_state,0,0x84);
    snprintf(pAVar2[(uint)slot_id].name,0x80,"Slot %d",(ulong)(slot_id + 1));
    for (sub = 0; sub < this->per_slot; sub = sub + 1) {
      clearSlotSub(this,slot_id,sub);
    }
    this->damaged = 1;
  }
  return;
}

Assistant:

void AutomationMgr::clearSlot(int slot_id)
{
    if(slot_id >= nslots || slot_id < 0)
        return;
    auto &s = slots[slot_id];
    s.active = false;
    s.used   = false;
    if(s.learning)
        learn_queue_len--;
    for(int i=0; i<nslots; ++i)
        if(slots[i].learning > s.learning)
            slots[i].learning--;
    s.learning = -1;
    s.midi_cc  = -1;
    s.midi_nrpn  = -1;
    s.current_state = 0;
    memset(s.name, 0, sizeof(s.name));
    snprintf(s.name, sizeof(s.name), "Slot %d", slot_id + 1);
    for(int i=0; i<per_slot; ++i)
        clearSlotSub(slot_id, i);
    damaged = true;
}